

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::DictionaryType::DictionaryType
          (DictionaryType *this,DictionaryType *from)

{
  bool bVar1;
  ValueType *pVVar2;
  DictionaryType *from_local;
  DictionaryType *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DictionaryType_006f0250;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_keytype(from);
  if (bVar1) {
    pVVar2 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(pVVar2,from->keytype_);
    this->keytype_ = pVVar2;
  }
  else {
    this->keytype_ = (ValueType *)0x0;
  }
  bVar1 = _internal_has_valuetype(from);
  if (bVar1) {
    pVVar2 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(pVVar2,from->valuetype_);
    this->valuetype_ = pVVar2;
  }
  else {
    this->valuetype_ = (ValueType *)0x0;
  }
  return;
}

Assistant:

DictionaryType::DictionaryType(const DictionaryType& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_keytype()) {
    keytype_ = new ::CoreML::Specification::MILSpec::ValueType(*from.keytype_);
  } else {
    keytype_ = nullptr;
  }
  if (from._internal_has_valuetype()) {
    valuetype_ = new ::CoreML::Specification::MILSpec::ValueType(*from.valuetype_);
  } else {
    valuetype_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.DictionaryType)
}